

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt.cpp
# Opt level: O0

vector<const_docopt::Option_*,_std::allocator<const_docopt::Option_*>_> *
flat_filter<docopt::Option_const>(Pattern *pattern)

{
  _func_bool_Pattern_ptr *p_Var1;
  iterator iVar2;
  iterator iVar3;
  back_insert_iterator<std::vector<const_docopt::Option_*,_std::allocator<const_docopt::Option_*>_>_>
  bVar4;
  vector<docopt::Pattern_*,_std::allocator<docopt::Pattern_*>_> *in_RSI;
  vector<const_docopt::Option_*,_std::allocator<const_docopt::Option_*>_> *in_RDI;
  vector<docopt::Pattern_*,_std::allocator<docopt::Pattern_*>_> flattened;
  vector<const_docopt::Option_*,_std::allocator<const_docopt::Option_*>_> *ret;
  vector<const_docopt::Option_*,_std::allocator<const_docopt::Option_*>_> *in_stack_ffffffffffffff68
  ;
  _lambda_docopt__Pattern_const___1_ local_29;
  undefined1 local_28 [40];
  
  p_Var1 = flat_filter(docopt::Pattern&)::{lambda(docopt::Pattern_const*)#1}::
           operator_cast_to_function_pointer(&local_29);
  (*(code *)*(in_RSI->super__Vector_base<docopt::Pattern_*,_std::allocator<docopt::Pattern_*>_>).
             _M_impl.super__Vector_impl_data._M_start)(local_28,in_RSI,p_Var1);
  std::vector<const_docopt::Option_*,_std::allocator<const_docopt::Option_*>_>::vector
            ((vector<const_docopt::Option_*,_std::allocator<const_docopt::Option_*>_> *)0x2c1784);
  iVar2 = std::vector<docopt::Pattern_*,_std::allocator<docopt::Pattern_*>_>::begin
                    ((vector<docopt::Pattern_*,_std::allocator<docopt::Pattern_*>_> *)
                     in_stack_ffffffffffffff68);
  iVar3 = std::vector<docopt::Pattern_*,_std::allocator<docopt::Pattern_*>_>::end
                    ((vector<docopt::Pattern_*,_std::allocator<docopt::Pattern_*>_> *)
                     in_stack_ffffffffffffff68);
  bVar4 = std::
          back_inserter<std::vector<docopt::Option_const*,std::allocator<docopt::Option_const*>>>
                    (in_stack_ffffffffffffff68);
  std::
  transform<__gnu_cxx::__normal_iterator<docopt::Pattern**,std::vector<docopt::Pattern*,std::allocator<docopt::Pattern*>>>,std::back_insert_iterator<std::vector<docopt::Option_const*,std::allocator<docopt::Option_const*>>>,flat_filter<docopt::Option_const>(docopt::Pattern&)::_lambda(docopt::Pattern*)_1_>
            (iVar2._M_current,iVar3._M_current,bVar4.container);
  std::vector<docopt::Pattern_*,_std::allocator<docopt::Pattern_*>_>::~vector(in_RSI);
  return in_RDI;
}

Assistant:

std::vector<T*> flat_filter(Pattern& pattern) {
	std::vector<Pattern*> flattened = pattern.flat([](Pattern const* p) -> bool {
		return dynamic_cast<T const*>(p);
	});
	
	// now, we're guaranteed to have T*'s, so just use static_cast
	std::vector<T*> ret;
	std::transform(flattened.begin(), flattened.end(), std::back_inserter(ret), [](Pattern* p) {
		return static_cast<T*>(p);
	});
	return ret;
}